

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::Matcher<const_unsigned_long_&>::Matcher
          (Matcher<const_unsigned_long_&> *this,unsigned_long *value)

{
  MatcherBase<const_unsigned_long_&> local_30;
  
  (this->super_MatcherBase<const_unsigned_long_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_unsigned_long_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_unsigned_long_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00203978;
  local_30.buffer_.i = *value;
  local_30.vtable_ =
       (VTable *)
       internal::MatcherBase<unsigned_long_const&>::
       GetVTable<testing::internal::MatcherBase<unsigned_long_const&>::ValuePolicy<testing::internal::EqMatcher<unsigned_long>,true>>()
       ::kVTable;
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00203978;
  internal::MatcherBase<const_unsigned_long_&>::operator=
            (&this->super_MatcherBase<const_unsigned_long_&>,&local_30);
  internal::MatcherBase<const_unsigned_long_&>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}